

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPostDepthCoverageTests.cpp
# Opt level: O2

int __thiscall
gl4cts::PostDepthSampleMaskCase::init(PostDepthSampleMaskCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  allocator<char> local_49;
  string local_48;
  long lVar4;
  
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_post_depth_coverage")
  ;
  if (bVar1) {
    std::__cxx11::string::assign((char *)&this->m_vertShader);
    std::__cxx11::string::assign((char *)&this->m_fragShader1a);
    std::__cxx11::string::assign((char *)&this->m_fragShader1b);
    std::__cxx11::string::assign((char *)&this->m_fragShader2);
    iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar4 = CONCAT44(extraout_var,iVar2);
    (**(code **)(lVar4 + 0x6e8))(1,&this->m_depthStencilRenderbuffer);
    (**(code **)(lVar4 + 0xa0))(0x8d41,this->m_depthStencilRenderbuffer);
    (**(code **)(lVar4 + 0x1240))(0x8d41,4,0x84f9,1,1);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glRenderbufferStorageMultisample",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPostDepthCoverageTests.cpp"
                    ,299);
    (**(code **)(lVar4 + 0x6f8))(1,&this->m_textureMS);
    (**(code **)(lVar4 + 0xb8))(0x9100,this->m_textureMS);
    (**(code **)(lVar4 + 0x1390))(0x9100,4,0x8058,1,1,1);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glTexStorage2DMultisample",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPostDepthCoverageTests.cpp"
                    ,0x130);
    (**(code **)(lVar4 + 0x6d0))(1,&this->m_framebufferMS);
    (**(code **)(lVar4 + 0x78))(0x8d40,this->m_framebufferMS);
    (**(code **)(lVar4 + 0x6a0))(0x8d40,0x8ce0,0x9100,this->m_textureMS,0);
    (**(code **)(lVar4 + 0x688))(0x8d40,0x8d00,0x8d41,this->m_depthStencilRenderbuffer);
    (**(code **)(lVar4 + 0x688))(0x8d40,0x8d20,0x8d41,this->m_depthStencilRenderbuffer);
    (**(code **)(lVar4 + 0x6f8))(1,&this->m_texture);
    (**(code **)(lVar4 + 0xb8))(0xde1,this->m_texture);
    (**(code **)(lVar4 + 0x1380))(0xde1,1,0x8058,1,4);
    (**(code **)(lVar4 + 0x6d0))(1,&this->m_framebuffer);
    (**(code **)(lVar4 + 0x78))(0x8d40,this->m_framebuffer);
    iVar2 = (**(code **)(lVar4 + 0x6a0))(0x8d40,0x8ce0,0xde1,this->m_texture,0);
    return iVar2;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"GL_ARB_post_depth_coverage not supported",&local_49);
  tcu::NotSupportedError::NotSupportedError(this_00,&local_48);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void PostDepthSampleMaskCase::init()
{
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_post_depth_coverage"))
		throw tcu::NotSupportedError("GL_ARB_post_depth_coverage not supported");

	m_vertShader = c_commonVertShader;

	m_fragShader1a = "#version 450\n"
					 "\n"
					 "#extension GL_ARB_post_depth_coverage : enable\n"
					 "\n"
					 "in vec2 texCoord;\n"
					 "out vec4 fragColor;\n"
					 "\n"
					 "void main()\n"
					 "{\n"
					 "    int samp1 = (gl_SampleMaskIn[0] & 0x1);\n"
					 "    int samp2 = (gl_SampleMaskIn[0] & 0x2) / 2;\n"
					 "    int samp3 = (gl_SampleMaskIn[0] & 0x4) / 4;\n"
					 "    int samp4 = (gl_SampleMaskIn[0] & 0x8) / 8;\n"
					 "    fragColor = vec4(samp1, samp2, samp3, samp4);\n"
					 "}\n";

	m_fragShader1b = "#version 450\n"
					 "\n"
					 "#extension GL_ARB_post_depth_coverage : enable\n"
					 "layout(post_depth_coverage) in;\n"
					 "\n"
					 "in vec2 texCoord;\n"
					 "out vec4 fragColor;\n"
					 "\n"
					 "void main()\n"
					 "{\n"
					 "    int samp1 = (gl_SampleMaskIn[0] & 0x1);\n"
					 "    int samp2 = (gl_SampleMaskIn[0] & 0x2) / 2;\n"
					 "    int samp3 = (gl_SampleMaskIn[0] & 0x4) / 4;\n"
					 "    int samp4 = (gl_SampleMaskIn[0] & 0x8) / 8;\n"
					 "    fragColor = vec4(samp1, samp2, samp3, samp4);\n"
					 "}\n";

	m_fragShader2 = "#version 450\n"
					"\n"
					"in vec2 texCoord;\n"
					"out vec4 fragColor;\n"
					"\n"
					"uniform sampler2DMS texture;\n"
					"\n"
					"void main()\n"
					"{\n"
					"    int samp = int(texCoord.y * 4);\n"
					"    fragColor = texelFetch(texture, ivec2(0, 0), samp);\n"
					"}\n";

	const Functions& gl = m_context.getRenderContext().getFunctions();

	gl.genRenderbuffers(1, &m_depthStencilRenderbuffer);
	gl.bindRenderbuffer(GL_RENDERBUFFER, m_depthStencilRenderbuffer);
	gl.renderbufferStorageMultisample(GL_RENDERBUFFER, 4, GL_DEPTH_STENCIL, 1, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glRenderbufferStorageMultisample");

	gl.genTextures(1, &m_textureMS);
	gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, m_textureMS);
	gl.texStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, 4, GL_RGBA8, 1, 1, GL_TRUE);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage2DMultisample");

	gl.genFramebuffers(1, &m_framebufferMS);
	gl.bindFramebuffer(GL_FRAMEBUFFER, m_framebufferMS);
	gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D_MULTISAMPLE, m_textureMS, 0);
	gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, m_depthStencilRenderbuffer);
	gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_RENDERBUFFER, m_depthStencilRenderbuffer);

	gl.genTextures(1, &m_texture);
	gl.bindTexture(GL_TEXTURE_2D, m_texture);
	gl.texStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, 1, 4);

	gl.genFramebuffers(1, &m_framebuffer);
	gl.bindFramebuffer(GL_FRAMEBUFFER, m_framebuffer);
	gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_texture, 0);
}